

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solitaire.cpp
# Opt level: O2

void __thiscall
solitaire::Solitaire::tryAddCardOnFoundationPileFromHand
          (Solitaire *this,shared_ptr<solitaire::piles::interfaces::FoundationPile> *pile)

{
  optional<solitaire::cards::Card> cardToAdd;
  Snapshot *local_30;
  _Head_base<0UL,_solitaire::archivers::interfaces::Snapshot_*,_false> local_28;
  _Storage<solitaire::cards::Card,_true> local_20;
  undefined1 local_18;
  
  (*(((pile->
      super___shared_ptr<solitaire::piles::interfaces::FoundationPile,_(__gnu_cxx::_Lock_policy)2>).
     _M_ptr)->super_Archiver)._vptr_Archiver[2])(&local_30);
  local_20 = *(_Storage<solitaire::cards::Card,_true> *)
              ((this->cardsInHand).
               super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
               _M_impl.super__Vector_impl_data._M_finish + -1);
  local_18 = 1;
  (*(((pile->
      super___shared_ptr<solitaire::piles::interfaces::FoundationPile,_(__gnu_cxx::_Lock_policy)2>).
     _M_ptr)->super_Archiver)._vptr_Archiver[4])();
  local_28._M_head_impl = local_30;
  local_30 = (Snapshot *)0x0;
  saveHistoryIfCardMovedToOtherPileAndClearHand
            (this,(optional<solitaire::cards::Card> *)&local_20._M_value,(SnapshotPtr *)&local_28);
  if (local_28._M_head_impl != (Snapshot *)0x0) {
    (*(local_28._M_head_impl)->_vptr_Snapshot[1])();
  }
  if (local_30 != (Snapshot *)0x0) {
    (*local_30->_vptr_Snapshot[1])();
  }
  return;
}

Assistant:

void Solitaire::tryAddCardOnFoundationPileFromHand(std::shared_ptr<FoundationPile>& pile) {
    auto snapshot = pile->createSnapshot();
    std::optional<Card> cardToAdd {cardsInHand.back()};
    pile->tryAddCard(cardToAdd);
    saveHistoryIfCardMovedToOtherPileAndClearHand(cardToAdd, std::move(snapshot));
}